

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearGE<1,_0>::propagate(LinearGE<1,_0> *this)

{
  Lit *pLVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  anon_union_8_2_743a5d44_for_Reason_0 aVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  IntView<2> *pIVar10;
  IntView<3> *pIVar11;
  ulong uVar12;
  long lVar13;
  uint j;
  int64_t iVar14;
  long lVar15;
  
  iVar14 = this->fix_sum;
  uVar12 = (ulong)(uint)this->fix_x;
  uVar5 = (ulong)(this->x).sz;
  piVar7 = &(this->x).data[uVar12].a;
  for (uVar8 = uVar12; uVar8 < uVar5; uVar8 = uVar8 + 1) {
    iVar14 = iVar14 + (long)*piVar7 * (long)(((IntView<2> *)(piVar7 + -2))->var->max).v;
    piVar7 = piVar7 + 4;
  }
  uVar8 = (ulong)(uint)this->fix_y;
  piVar7 = &(this->y).data[uVar8].a;
  for (; uVar8 < (this->y).sz; uVar8 = uVar8 + 1) {
    iVar14 = iVar14 + (long)*piVar7 * -(long)(((IntView<3> *)(piVar7 + -2))->var->min).v;
    piVar7 = piVar7 + 4;
  }
  for (; (uint)uVar12 < (uint)uVar5; uVar12 = (ulong)((uint)uVar12 + 1)) {
    pIVar10 = (this->x).data;
    lVar15 = (long)((pIVar10[uVar12].var)->max).v * (long)pIVar10[uVar12].a - iVar14;
    if ((long)((pIVar10[uVar12].var)->min).v * (long)pIVar10[uVar12].a < lVar15) {
      if (so.lazy == true) {
        lVar13 = 0;
        for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
          iVar4 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar13) + 0x48))();
          (this->ps).data[uVar8].x = iVar4;
          uVar5 = (ulong)(this->x).sz;
          lVar13 = lVar13 + 0x10;
        }
        lVar13 = 0;
        for (uVar8 = 0; uVar8 < (this->y).sz; uVar8 = uVar8 + 1) {
          iVar4 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar13) + 0x40))();
          (this->ps).data[(this->x).sz + (int)uVar8].x = iVar4;
          lVar13 = lVar13 + 0x10;
        }
        pLVar1 = (this->ps).data;
        pLVar1[uVar12].x = pLVar1->x;
        aVar6._pt = Reason_new<vec<Lit>>(&this->ps);
        pIVar10 = (this->x).data;
      }
      else {
        aVar6._pt = (Clause *)0x0;
      }
      bVar2 = IntView<2>::setMin(pIVar10 + uVar12,lVar15,(Reason)aVar6,true);
      if (!bVar2) {
        return false;
      }
      uVar5 = (ulong)(this->x).sz;
    }
  }
  uVar9 = this->fix_y;
  do {
    bVar2 = (this->y).sz <= uVar9;
    if (bVar2) {
      return true;
    }
    pIVar11 = (this->y).data;
    lVar15 = -(long)((pIVar11[uVar9].var)->min).v * (long)pIVar11[uVar9].a - iVar14;
    if (-(long)((pIVar11[uVar9].var)->max).v * (long)pIVar11[uVar9].a < lVar15) {
      if (so.lazy == true) {
        lVar13 = 0;
        for (uVar8 = 0; uVar8 < (this->x).sz; uVar8 = uVar8 + 1) {
          iVar4 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar13) + 0x48))();
          (this->ps).data[uVar8].x = iVar4;
          lVar13 = lVar13 + 0x10;
        }
        lVar13 = 0;
        for (uVar8 = 0; uVar8 < (this->y).sz; uVar8 = uVar8 + 1) {
          iVar4 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar13) + 0x40))();
          (this->ps).data[(this->x).sz + (int)uVar8].x = iVar4;
          lVar13 = lVar13 + 0x10;
        }
        pLVar1 = (this->ps).data;
        pLVar1[(this->x).sz + uVar9].x = pLVar1->x;
        aVar6._pt = Reason_new<vec<Lit>>(&this->ps);
        pIVar11 = (this->y).data;
      }
      else {
        aVar6._pt = (Clause *)0x0;
      }
      bVar3 = IntView<3>::setMin(pIVar11 + uVar9,lVar15,(Reason)aVar6,true);
      if (!bVar3) {
        return bVar2;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}